

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

void remove_filelist(HtsVoiceFilelist *list)

{
  undefined8 *in_RDI;
  HtsVoiceFilelist *prev;
  undefined8 *local_10;
  undefined8 *local_8;
  
  local_10 = (undefined8 *)0x0;
  for (local_8 = in_RDI; local_8 != (undefined8 *)0x0; local_8 = (undefined8 *)*local_8) {
    if (local_10 != (undefined8 *)0x0) {
      free(local_10);
    }
    if (local_8[1] != 0) {
      free((void *)local_8[1]);
    }
    if (local_8[2] != 0) {
      free((void *)local_8[2]);
    }
    local_10 = local_8;
  }
  if (local_10 != (undefined8 *)0x0) {
    free(local_10);
  }
  return;
}

Assistant:

void remove_filelist(HtsVoiceFilelist *list)
{
	HtsVoiceFilelist *prev = NULL;
	while (list != NULL)
	{
		if (prev != NULL)
		{
			free(prev);
		}
		if (list->path)
		{
			free(list->path);
		}
		if (list->name)
		{
			free(list->name);
		}
		prev = list;
		list = list->succ;
	}
	if (prev != NULL)
	{
		free(prev);
	}
}